

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

float ncnn::intersection_area(BBoxRect *a,BBoxRect *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  long in_RSI;
  long in_RDI;
  float inter_height;
  float inter_width;
  undefined4 local_4;
  
  if ((((*(float *)(in_RSI + 0xc) <= *(float *)(in_RDI + 4) &&
         *(float *)(in_RDI + 4) != *(float *)(in_RSI + 0xc)) ||
       (*(float *)(in_RDI + 0xc) < *(float *)(in_RSI + 4))) ||
      (*(float *)(in_RSI + 0x10) <= *(float *)(in_RDI + 8) &&
       *(float *)(in_RDI + 8) != *(float *)(in_RSI + 0x10))) ||
     (*(float *)(in_RDI + 0x10) < *(float *)(in_RSI + 8))) {
    local_4 = 0.0;
  }
  else {
    pfVar4 = std::min<float>((float *)(in_RDI + 0xc),(float *)(in_RSI + 0xc));
    fVar1 = *pfVar4;
    pfVar4 = std::max<float>((float *)(in_RDI + 4),(float *)(in_RSI + 4));
    fVar2 = *pfVar4;
    pfVar4 = std::min<float>((float *)(in_RDI + 0x10),(float *)(in_RSI + 0x10));
    fVar3 = *pfVar4;
    pfVar4 = std::max<float>((float *)(in_RDI + 8),(float *)(in_RSI + 8));
    local_4 = (fVar1 - fVar2) * (fVar3 - *pfVar4);
  }
  return local_4;
}

Assistant:

static inline float intersection_area(const Yolov3DetectionOutput::BBoxRect& a, const Yolov3DetectionOutput::BBoxRect& b)
{
    if (a.xmin > b.xmax || a.xmax < b.xmin || a.ymin > b.ymax || a.ymax < b.ymin)
    {
        // no intersection
        return 0.f;
    }

    float inter_width = std::min(a.xmax, b.xmax) - std::max(a.xmin, b.xmin);
    float inter_height = std::min(a.ymax, b.ymax) - std::max(a.ymin, b.ymin);

    return inter_width * inter_height;
}